

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O0

void __thiscall Nes_Apu::write_register(Nes_Apu *this,nes_time_t time,nes_addr_t addr,int data)

{
  Nes_Osc *pNVar1;
  uint uVar2;
  uint in_ECX;
  uint uVar3;
  int iVar4;
  uint in_EDX;
  int in_ESI;
  Nes_Apu *in_RDI;
  bool bVar5;
  bool irq_enabled;
  int old_enables;
  bool recalc_irq;
  int i;
  int reg;
  Nes_Osc *osc;
  int osc_index;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  
  if (in_EDX - 0x4000 < 0x18) {
    run_until_((Nes_Apu *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
    if (in_EDX < 0x4014) {
      uVar3 = in_EDX - 0x4000 >> 2;
      pNVar1 = in_RDI->oscs[(int)uVar3];
      uVar2 = in_EDX & 3;
      pNVar1->regs[(int)uVar2] = (uchar)in_ECX;
      pNVar1->reg_written[(int)uVar2] = true;
      if (uVar3 == 4) {
        Nes_Dmc::write_register
                  ((Nes_Dmc *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      }
      else if (uVar2 == 3) {
        if ((in_RDI->osc_enables >> ((byte)uVar3 & 0x1f) & 1U) != 0) {
          pNVar1->length_counter = (uint)length_table[(int)((int)in_ECX >> 3 & 0x1f)];
        }
        if (uVar3 < 2) {
          *(undefined4 *)&pNVar1[1].output = 7;
        }
      }
    }
    else if (in_EDX == 0x4015) {
      local_28 = 5;
      while (iVar4 = local_28 + -1, local_28 != 0) {
        local_28 = iVar4;
        if (((int)in_ECX >> ((byte)iVar4 & 0x1f) & 1U) == 0) {
          in_RDI->oscs[iVar4]->length_counter = 0;
        }
      }
      uVar3 = ((in_RDI->dmc).irq_flag & 1) << 0x18;
      (in_RDI->dmc).irq_flag = false;
      uVar2 = in_RDI->osc_enables;
      in_RDI->osc_enables = in_ECX;
      if ((in_ECX & 0x10) == 0) {
        (in_RDI->dmc).next_irq = 0x40000000;
        uVar3 = 0x1000000;
      }
      else if ((uVar2 & 0x10) == 0) {
        Nes_Dmc::start((Nes_Dmc *)in_RDI);
      }
      if ((uVar3 & 0x1000000) != 0) {
        irq_changed(in_RDI);
      }
    }
    else if (in_EDX == 0x4017) {
      in_RDI->frame_mode = in_ECX;
      bVar5 = (in_ECX & 0x40) == 0;
      in_RDI->irq_flag = (in_RDI->irq_flag & 1U & bVar5) != 0;
      in_RDI->next_irq = 0x40000000;
      in_RDI->frame_delay = in_RDI->frame_delay & 1;
      in_RDI->frame = 0;
      if ((in_ECX & 0x80) == 0) {
        in_RDI->frame = 1;
        in_RDI->frame_delay = in_RDI->frame_period + in_RDI->frame_delay;
        if (bVar5) {
          in_RDI->next_irq = in_ESI + in_RDI->frame_delay + in_RDI->frame_period * 3 + 1;
        }
      }
      irq_changed(in_RDI);
    }
  }
  return;
}

Assistant:

void Nes_Apu::write_register( nes_time_t time, nes_addr_t addr, int data )
{
	require( addr > 0x20 ); // addr must be actual address (i.e. 0x40xx)
	require( (unsigned) data <= 0xFF );
	
	// Ignore addresses outside range
	if ( unsigned (addr - start_addr) > end_addr - start_addr )
		return;
	
	run_until_( time );
	
	if ( addr < 0x4014 )
	{
		// Write to channel
		int osc_index = (addr - start_addr) >> 2;
		Nes_Osc* osc = oscs [osc_index];
		
		int reg = addr & 3;
		osc->regs [reg] = data;
		osc->reg_written [reg] = true;
		
		if ( osc_index == 4 )
		{
			// handle DMC specially
			dmc.write_register( reg, data );
		}
		else if ( reg == 3 )
		{
			// load length counter
			if ( (osc_enables >> osc_index) & 1 )
				osc->length_counter = length_table [(data >> 3) & 0x1F];
			
			// reset square phase
			if ( osc_index < 2 )
				((Nes_Square*) osc)->phase = Nes_Square::phase_range - 1;
		}
	}
	else if ( addr == 0x4015 )
	{
		// Channel enables
		for ( int i = osc_count; i--; )
			if ( !((data >> i) & 1) )
				oscs [i]->length_counter = 0;
		
		bool recalc_irq = dmc.irq_flag;
		dmc.irq_flag = false;
		
		int old_enables = osc_enables;
		osc_enables = data;
		if ( !(data & 0x10) ) {
			dmc.next_irq = no_irq;
			recalc_irq = true;
		}
		else if ( !(old_enables & 0x10) ) {
			dmc.start(); // dmc just enabled
		}
		
		if ( recalc_irq )
			irq_changed();
	}
	else if ( addr == 0x4017 )
	{
		// Frame mode
		frame_mode = data;
		
		bool irq_enabled = !(data & 0x40);
		irq_flag &= irq_enabled;
		next_irq = no_irq;
		
		// mode 1
		frame_delay = (frame_delay & 1);
		frame = 0;
		
		if ( !(data & 0x80) )
		{
			// mode 0
			frame = 1;
			frame_delay += frame_period;
			if ( irq_enabled )
				next_irq = time + frame_delay + frame_period * 3 + 1;
		}
		
		irq_changed();
	}
}